

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O2

void deqp::gls::InteractionTestUtil::computeRandomRenderState
               (Random *rnd,RenderState *state,ApiType apiType,int targetWidth,int targetHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 *last;
  int ndx;
  long lVar7;
  deUint32 *first;
  float fVar8;
  float fVar9;
  undefined8 local_40;
  undefined8 uStack_38;
  
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->scissorTestEnabled = fVar8 < 0.2;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->stencilTestEnabled = fVar8 < 0.4;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->depthTestEnabled = fVar8 < 0.6;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->blendEnabled = fVar8 < 0.4;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->ditherEnabled = fVar8 < 0.5;
  if (state->scissorTestEnabled == true) {
    fVar8 = ceilf((float)targetWidth * 0.7);
    fVar9 = ceilf((float)targetHeight * 0.7);
    iVar1 = de::Random::getInt(rnd,(int)fVar8,targetWidth + 0x14);
    iVar2 = de::Random::getInt(rnd,(int)fVar9,targetHeight + 0x14);
    iVar3 = de::Random::getInt(rnd,-10,(targetWidth - iVar1) + 10);
    iVar4 = de::Random::getInt(rnd,-10,(targetHeight - iVar2) + 10);
    (state->scissorRectangle).left = iVar3;
    (state->scissorRectangle).bottom = iVar4;
    (state->scissorRectangle).width = iVar1;
    (state->scissorRectangle).height = iVar2;
  }
  if (state->stencilTestEnabled == true) {
    for (lVar7 = 0; lVar7 != 0x38; lVar7 = lVar7 + 0x1c) {
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::compareFuncs,
                         computeRandomRenderState::stencilOps);
      *(uint *)((long)&state->stencil[0].function + lVar7) = uVar5;
      dVar6 = deRandom_getUint32(&rnd->m_rnd);
      *(uint *)((long)&state->stencil[0].reference + lVar7) = dVar6 % 0x108 - 3;
      dVar6 = deRandom_getUint32(&rnd->m_rnd);
      *(deUint32 *)((long)&state->stencil[0].compareMask + lVar7) = dVar6;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      *(uint *)((long)&state->stencil[0].stencilFailOp + lVar7) = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      *(uint *)((long)&state->stencil[0].depthFailOp + lVar7) = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      *(uint *)((long)&state->stencil[0].depthPassOp + lVar7) = uVar5;
      dVar6 = deRandom_getUint32(&rnd->m_rnd);
      *(deUint32 *)((long)&state->stencil[0].writeMask + lVar7) = dVar6;
    }
  }
  if (state->depthTestEnabled == true) {
    uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (rnd,computeRandomRenderState::compareFuncs,
                       computeRandomRenderState::stencilOps);
    state->depthFunc = uVar5;
    fVar8 = deRandom_getFloat(&rnd->m_rnd);
    state->depthWriteMask = fVar8 < 0.7;
  }
  if (state->blendEnabled == true) {
    if (apiType.m_bits == 2) {
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_019028d8);
      (state->blendRGBState).equation = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (state->blendRGBState).srcFunc = uVar5;
      first = computeRandomRenderState::blendFuncsDstES2;
      last = (deUint32 *)&DAT_01902918;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendFuncsDstES2,(uint *)&DAT_01902918);
      (state->blendRGBState).dstFunc = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_019028d8);
      (state->blendAState).equation = uVar5;
    }
    else {
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01902884);
      (state->blendRGBState).equation = uVar5;
      first = computeRandomRenderState::blendFuncs;
      last = computeRandomRenderState::blendEquationsES2;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (state->blendRGBState).srcFunc = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (state->blendRGBState).dstFunc = uVar5;
      uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01902884);
      (state->blendAState).equation = uVar5;
    }
    uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (rnd,computeRandomRenderState::blendFuncs,
                       computeRandomRenderState::blendEquationsES2);
    (state->blendAState).srcFunc = uVar5;
    uVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>(rnd,first,last);
    (state->blendAState).dstFunc = uVar5;
    getRandomColor((InteractionTestUtil *)&local_40,rnd);
    *(undefined8 *)(state->blendColor).m_data = local_40;
    *(undefined8 *)((state->blendColor).m_data + 2) = uStack_38;
  }
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    fVar8 = deRandom_getFloat(&rnd->m_rnd);
    (state->colorMask).m_data[lVar7] = fVar8 < 0.7;
  }
  return;
}

Assistant:

void computeRandomRenderState (de::Random& rnd, RenderState& state, glu::ApiType apiType, int targetWidth, int targetHeight)
{
	// Constants governing randomization.
	const float		scissorTestProbability		= 0.2f;
	const float		stencilTestProbability		= 0.4f;
	const float		depthTestProbability		= 0.6f;
	const float		blendProbability			= 0.4f;
	const float		ditherProbability			= 0.5f;

	const float		depthWriteProbability		= 0.7f;
	const float		colorWriteProbability		= 0.7f;

	const int		minStencilVal				= -3;
	const int		maxStencilVal				= 260;

	const int		maxScissorOutOfBounds		= 10;
	const float		minScissorSize				= 0.7f;

	static const deUint32 compareFuncs[] =
	{
		GL_NEVER,
		GL_ALWAYS,
		GL_LESS,
		GL_LEQUAL,
		GL_EQUAL,
		GL_GEQUAL,
		GL_GREATER,
		GL_NOTEQUAL
	};

	static const deUint32 stencilOps[] =
	{
		GL_KEEP,
		GL_ZERO,
		GL_REPLACE,
		GL_INCR,
		GL_DECR,
		GL_INVERT,
		GL_INCR_WRAP,
		GL_DECR_WRAP
	};

	static const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	static const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	static const deUint32 blendEquationsES2[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT
	};

	static const deUint32 blendFuncsDstES2[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA
	};

	state.scissorTestEnabled	= rnd.getFloat() < scissorTestProbability;
	state.stencilTestEnabled	= rnd.getFloat() < stencilTestProbability;
	state.depthTestEnabled		= rnd.getFloat() < depthTestProbability;
	state.blendEnabled			= rnd.getFloat() < blendProbability;
	state.ditherEnabled			= rnd.getFloat() < ditherProbability;

	if (state.scissorTestEnabled)
	{
		int minScissorW		= deCeilFloatToInt32(minScissorSize * (float)targetWidth);
		int minScissorH		= deCeilFloatToInt32(minScissorSize * (float)targetHeight);
		int maxScissorW		= targetWidth + 2*maxScissorOutOfBounds;
		int maxScissorH		= targetHeight + 2*maxScissorOutOfBounds;

		int scissorW		= rnd.getInt(minScissorW, maxScissorW);
		int	scissorH		= rnd.getInt(minScissorH, maxScissorH);
		int scissorX		= rnd.getInt(-maxScissorOutOfBounds, targetWidth+maxScissorOutOfBounds-scissorW);
		int scissorY		= rnd.getInt(-maxScissorOutOfBounds, targetHeight+maxScissorOutOfBounds-scissorH);

		state.scissorRectangle = rr::WindowRectangle(scissorX, scissorY, scissorW, scissorH);
	}

	if (state.stencilTestEnabled)
	{
		for (int ndx = 0; ndx < 2; ndx++)
		{
			state.stencil[ndx].function			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
			state.stencil[ndx].reference		= rnd.getInt(minStencilVal, maxStencilVal);
			state.stencil[ndx].compareMask		= rnd.getUint32();
			state.stencil[ndx].stencilFailOp	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthFailOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthPassOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].writeMask		= rnd.getUint32();
		}
	}

	if (state.depthTestEnabled)
	{
		state.depthFunc			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
		state.depthWriteMask	= rnd.getFloat() < depthWriteProbability;
	}

	if (state.blendEnabled)
	{
		if (apiType == glu::ApiType::es(2,0))
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));
		}
		else
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
		}

		state.blendColor				= getRandomColor(rnd);
	}

	for (int ndx = 0; ndx < 4; ndx++)
		state.colorMask[ndx] = rnd.getFloat() < colorWriteProbability;
}